

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_arithmetic.cpp
# Opt level: O0

bool dxil_spv::get_expression_upper_bound(Value *value,double *boundary_value)

{
  bool bVar1;
  bool bVar2;
  BinaryOps BVar3;
  uint uVar4;
  BinaryOperator *this;
  CallInst *pCVar5;
  Value *pVVar6;
  pair<const_LLVMBC::Value_*,_double> pVar7;
  pair<const_LLVMBC::Value_*,_double> pVar8;
  Value *local_a0;
  uint local_8c;
  uint i;
  CallInst *dot;
  CallInst *rsqrt;
  Value *mul_value;
  bool is_normalizing1;
  Value *pVStack_68;
  bool is_normalizing0;
  pair<const_LLVMBC::Value_*,_double> split1;
  pair<const_LLVMBC::Value_*,_double> split0;
  Value *op1;
  Value *op0;
  BinaryOperator *bin_op;
  pair<const_LLVMBC::Value_*,_double> overall_split;
  double *boundary_value_local;
  Value *value_local;
  
  pVar7 = split_constant_multipliers(value);
  bin_op = (BinaryOperator *)pVar7.first;
  overall_split.first = (Value *)pVar7.second;
  if (bin_op == (BinaryOperator *)0x0) {
    *boundary_value = (double)overall_split.first;
    return true;
  }
  this = LLVMBC::dyn_cast<LLVMBC::BinaryOperator>((Value *)bin_op);
  if (this != (BinaryOperator *)0x0) {
    BVar3 = LLVMBC::BinaryOperator::getOpcode(this);
    if (BVar3 != FMul) {
      return false;
    }
    op1 = LLVMBC::Instruction::getOperand(&this->super_Instruction,0);
    split0.second = (double)LLVMBC::Instruction::getOperand(&this->super_Instruction,1);
    pVar7 = split_constant_multipliers(op1);
    pVar8 = split_constant_multipliers((Value *)split0.second);
    split0.first = (Value *)pVar7.second;
    if (((double)split0.first < 0.0) ||
       (split1.first = (Value *)pVar8.second, (double)split1.first < 0.0)) {
      return false;
    }
    split1.second = (double)pVar7.first;
    if (split1.second != 0.0) {
      op1 = (Value *)split1.second;
    }
    pVStack_68 = pVar8.first;
    if (pVStack_68 != (Value *)0x0) {
      split0.second = (double)pVStack_68;
    }
    bVar1 = is_canonically_normalizing_value((Value *)split1.second);
    bVar2 = is_canonically_normalizing_value(pVStack_68);
    if ((bVar1) || (bVar2)) {
      if (bVar1) {
        local_a0 = op1;
      }
      else {
        local_a0 = (Value *)split0.second;
        split0.second = (double)op1;
      }
      pCVar5 = LLVMBC::cast<LLVMBC::CallInst>(local_a0);
      pVVar6 = LLVMBC::Instruction::getOperand(&pCVar5->super_Instruction,1);
      pCVar5 = LLVMBC::cast<LLVMBC::CallInst>(pVVar6);
      for (local_8c = 1; uVar4 = LLVMBC::Instruction::getNumOperands(&pCVar5->super_Instruction),
          local_8c < uVar4; local_8c = local_8c + 1) {
        pVVar6 = LLVMBC::Instruction::getOperand(&pCVar5->super_Instruction,local_8c);
        if (pVVar6 == (Value *)split0.second) {
          *boundary_value =
               (double)overall_split.first * (double)split0.first * (double)split1.first;
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

static bool get_expression_upper_bound(const llvm::Value *value, double &boundary_value)
{
	auto overall_split = split_constant_multipliers(value);
	value = overall_split.first;
	if (!overall_split.first)
	{
		boundary_value = overall_split.second;
		return true;
	}

	// Simple analysis to find what we want to see.
	if (auto *bin_op = llvm::dyn_cast<llvm::BinaryOperator>(value))
	{
		if (bin_op->getOpcode() != llvm::BinaryOperator::BinaryOps::FMul)
			return false;

		const llvm::Value *op0 = bin_op->getOperand(0);
		const llvm::Value *op1 = bin_op->getOperand(1);

		auto split0 = split_constant_multipliers(op0);
		auto split1 = split_constant_multipliers(op1);

		// Don't want to deal with any negative numbers here since the definition of max and min flip.
		if (split0.second < 0.0 || split1.second < 0.0)
			return false;

		if (split0.first)
			op0 = split0.first;
		if (split1.first)
			op1 = split1.first;

		bool is_normalizing0 = is_canonically_normalizing_value(split0.first);
		bool is_normalizing1 = is_canonically_normalizing_value(split1.first);

		if (is_normalizing0 || is_normalizing1)
		{
			const llvm::Value *mul_value = is_normalizing0 ? op1 : op0;
			auto *rsqrt = llvm::cast<llvm::CallInst>(is_normalizing0 ? op0 : op1);
			auto *dot = llvm::cast<llvm::CallInst>(rsqrt->getOperand(1));
			for (unsigned i = 1; i < dot->getNumOperands(); i++)
			{
				if (dot->getOperand(i) == mul_value)
				{
					boundary_value = overall_split.second * split0.second * split1.second;
					return true;
				}
			}
		}
	}

	return false;
}